

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

StringSliceWTF * __thiscall
wasm::Builder::makeStringSliceWTF(Builder *this,Expression *ref,Expression *start,Expression *end)

{
  StringSliceWTF *pSVar1;
  StringSliceWTF *ret;
  Expression *end_local;
  Expression *start_local;
  Expression *ref_local;
  Builder *this_local;
  
  pSVar1 = MixedArena::alloc<wasm::StringSliceWTF>(&this->wasm->allocator);
  pSVar1->ref = ref;
  pSVar1->start = start;
  pSVar1->end = end;
  wasm::StringSliceWTF::finalize();
  return pSVar1;
}

Assistant:

StringSliceWTF*
  makeStringSliceWTF(Expression* ref, Expression* start, Expression* end) {
    auto* ret = wasm.allocator.alloc<StringSliceWTF>();
    ret->ref = ref;
    ret->start = start;
    ret->end = end;
    ret->finalize();
    return ret;
  }